

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkTestTools.cpp
# Opt level: O3

void test::LogTonkStatus(SDKConnection *connection)

{
  ostringstream *this;
  size_t sVar1;
  OutputWorker *this_00;
  TonkStatus status;
  ostringstream ss;
  TonkStatusEx statusEx;
  TonkStatus local_3c8;
  char *local_3b0;
  long local_3a8;
  char local_3a0 [16];
  ostringstream local_390 [112];
  ios_base local_320 [264];
  TonkStatusEx local_218;
  undefined1 local_198 [392];
  
  tonk::SDKConnection::GetStatus(&local_3c8,connection);
  tonk::SDKConnection::GetStatusEx(&local_218,connection);
  std::__cxx11::ostringstream::ostringstream(local_390);
  if ((local_3c8.Flags >> 0x18 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_390,"TonkFlag_Connecting ",0x14);
  }
  if ((local_3c8.Flags >> 0x19 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_390,"TonkFlag_Connected ",0x13);
  }
  if ((local_3c8.Flags >> 0x1a & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_390,"TonkFlag_Disconnected ",0x16);
  }
  if ((local_3c8.Flags >> 0x1c & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_390,"TonkFlag_Initiated ",0x13);
  }
  if ((local_3c8.Flags & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_390,"TonkFlag_TimeSync ",0x12);
  }
  if ((local_3c8.Flags >> 8 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_390,"TonkFlag_NATMap_Local ",0x16);
  }
  if ((local_3c8.Flags >> 9 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_390,"TonkFlag_NATMap_Remote ",0x17);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_390," AppBPS=",8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_390);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_390," ReliableQueueMsec=",0x13);
  std::ostream::_M_insert<unsigned_long>((ulong)local_390);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_390," LowPriQueueMsec=",0x11);
  std::ostream::_M_insert<unsigned_long>((ulong)local_390);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_390," RemoteId=",10);
  std::ostream::_M_insert<unsigned_long>((ulong)local_390);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_390," LocalId=",9);
  std::ostream::_M_insert<unsigned_long>((ulong)local_390);
  if (local_218.LocalNATMapExternalPort != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_390," LocalUPnPPort=",0xf);
    std::ostream::_M_insert<unsigned_long>((ulong)local_390);
  }
  if (local_218.RemoteNATMapExternalPort != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_390," RemoteUPnPPort=",0x10)
    ;
    std::ostream::_M_insert<unsigned_long>((ulong)local_390);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_390," Self=",6);
  sVar1 = strlen(local_218.Local.NetworkString);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_390,local_218.Local.NetworkString,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_390,":",1);
  std::ostream::_M_insert<unsigned_long>((ulong)local_390);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_390," Remote=",8);
  sVar1 = strlen(local_218.Remote.NetworkString);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_390,local_218.Remote.NetworkString,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_390,":",1);
  std::ostream::_M_insert<unsigned_long>((ulong)local_390);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_390," PeerSeenBPS=",0xd);
  std::ostream::_M_insert<unsigned_long>((ulong)local_390);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_390," PeerSeenLossRate=",0x12)
  ;
  std::ostream::_M_insert<double>((double)local_218.PeerSeenLossRate);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_390," IncomingBPS=",0xd);
  std::ostream::_M_insert<unsigned_long>((ulong)local_390);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_390," IncomingLossRate=",0x12)
  ;
  std::ostream::_M_insert<double>((double)local_218.IncomingLossRate);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_390," TripUsec=",10);
  std::ostream::_M_insert<unsigned_long>((ulong)local_390);
  std::__cxx11::stringbuf::str();
  if (DAT_00110280 < 3) {
    this = (ostringstream *)(local_198 + 0x10);
    local_198._0_8_ = Logger;
    local_198._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,DAT_001102b0,DAT_001102b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"tonk_status: ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,local_3b0,local_3a8);
    this_00 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_00,(LogStringBuffer *)local_198);
    std::__cxx11::ostringstream::~ostringstream(this);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
  }
  if (local_3b0 != local_3a0) {
    operator_delete(local_3b0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_390);
  std::ios_base::~ios_base(local_320);
  return;
}

Assistant:

void LogTonkStatus(tonk::SDKConnection* connection)
{
    TonkStatus status = connection->GetStatus();
    TonkStatusEx statusEx = connection->GetStatusEx();

    std::ostringstream ss;
    if (status.Flags & TonkFlag_Connecting) {
        ss << "TonkFlag_Connecting ";
    }
    if (status.Flags & TonkFlag_Connected) {
        ss << "TonkFlag_Connected ";
    }
    if (status.Flags & TonkFlag_Disconnected) {
        ss << "TonkFlag_Disconnected ";
    }
    if (status.Flags & TonkFlag_Initiated) {
        ss << "TonkFlag_Initiated ";
    }
    if (status.Flags & TonkFlag_TimeSync) {
        ss << "TonkFlag_TimeSync ";
    }
    if (status.Flags & TonkFlag_NATMap_Local) {
        ss << "TonkFlag_NATMap_Local ";
    }
    if (status.Flags & TonkFlag_NATMap_Remote) {
        ss << "TonkFlag_NATMap_Remote ";
    }
    ss << " AppBPS=" << status.AppBPS;
    ss << " ReliableQueueMsec=" << status.ReliableQueueMsec;
    ss << " LowPriQueueMsec=" << status.LowPriQueueMsec;
    //ss << " ConnectionKey=" << statusEx.ConnectionKey;
    ss << " RemoteId=" << status.LocallyAssignedIdForRemoteHost;
    ss << " LocalId=" << statusEx.RemoteAssignedIdForLocalHost;
    if (statusEx.LocalNATMapExternalPort != 0) {
        ss << " LocalUPnPPort=" << statusEx.LocalNATMapExternalPort;
    }
    if (statusEx.RemoteNATMapExternalPort != 0) {
        ss << " RemoteUPnPPort=" << statusEx.RemoteNATMapExternalPort;
    }
    ss << " Self=" << statusEx.Local.NetworkString << ":" << statusEx.Local.UDPPort;
    ss << " Remote=" << statusEx.Remote.NetworkString << ":" << statusEx.Remote.UDPPort;
    ss << " PeerSeenBPS=" << statusEx.PeerSeenBPS;
    ss << " PeerSeenLossRate=" << statusEx.PeerSeenLossRate;
    ss << " IncomingBPS=" << statusEx.IncomingBPS;
    ss << " IncomingLossRate=" << statusEx.IncomingLossRate;
    ss << " TripUsec=" << statusEx.TripUsec;
    Logger.Info("tonk_status: ", ss.str());
}